

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int parse_line(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mp,int *parsed_kws)

{
  byte *src;
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t n;
  int64_t iVar6;
  int64_t iVar7;
  int64_t ns;
  long lVar8;
  int iVar9;
  mtree_option *pmVar10;
  dev_t dev;
  byte *local_58;
  archive_read *local_50;
  dev_t local_48;
  archive_string *local_40;
  mtree *local_38;
  
  pmVar10 = mp->options;
  local_50 = a;
  if (pmVar10 != (mtree_option *)0x0) {
    local_40 = &mtree->contents_name;
    iVar9 = 0;
    local_38 = mtree;
    do {
      __s1 = pmVar10->value;
      cVar1 = *__s1;
      iVar2 = 0;
      if (cVar1 == '\0') goto LAB_0020bcb2;
      iVar2 = strcmp(__s1,"nochange");
      if (iVar2 == 0) {
        *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 0x10;
        goto LAB_0020bcaf;
      }
      iVar2 = strcmp(__s1,"optional");
      if (iVar2 == 0) {
        *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 8;
        goto LAB_0020bcaf;
      }
      iVar3 = strcmp(__s1,"ignore");
      iVar2 = 0;
      if (iVar3 == 0) goto LAB_0020bcb2;
      pcVar5 = strchr(__s1,0x3d);
      if (pcVar5 == (char *)0x0) {
        archive_set_error(&local_50->archive,0x54,"Malformed attribute \"%s\" (%d)",__s1,
                          (ulong)(uint)(int)cVar1);
        goto LAB_0020bce8;
      }
      *pcVar5 = '\0';
      src = (byte *)(pcVar5 + 1);
      local_58 = src;
      switch(*__s1) {
      case 'c':
        iVar2 = strcmp(__s1,"content");
        if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"contents"), iVar2 == 0)) {
          iVar2 = 0;
          parse_escapes((char *)src,(mtree_entry *)0x0);
          (local_38->contents_name).length = 0;
          n = strlen((char *)src);
          archive_strncat(local_40,src,n);
        }
        else {
          iVar3 = strcmp(__s1,"cksum");
          iVar2 = 0;
          if (iVar3 != 0) goto switchD_0020b973_caseD_64;
        }
        break;
      case 'd':
switchD_0020b973_caseD_64:
        iVar2 = strcmp(__s1,"device");
        if (iVar2 != 0) goto switchD_0020b973_caseD_66;
        *(byte *)parsed_kws = (byte)*parsed_kws | 1;
        iVar2 = parse_device(&local_48,&local_50->archive,(char *)src);
        if (iVar2 == 0) {
          archive_entry_set_rdev(entry,local_48);
        }
        break;
      default:
        goto switchD_0020b973_caseD_65;
      case 'f':
switchD_0020b973_caseD_66:
        iVar2 = strcmp(__s1,"flags");
        if (iVar2 == 0) {
          *(byte *)parsed_kws = (byte)*parsed_kws | 2;
          archive_entry_copy_fflags_text(entry,(char *)src);
          goto LAB_0020bcaf;
        }
      case 'g':
        iVar2 = strcmp(__s1,"gid");
        if (iVar2 == 0) {
          *(byte *)parsed_kws = (byte)*parsed_kws | 4;
          iVar6 = mtree_atol10((char **)&local_58);
          archive_entry_set_gid(entry,iVar6);
        }
        else {
          iVar2 = strcmp(__s1,"gname");
          if (iVar2 == 0) {
            *(byte *)parsed_kws = (byte)*parsed_kws | 8;
            archive_entry_copy_gname(entry,(char *)src);
          }
          else {
switchD_0020b973_caseD_69:
            iVar2 = strcmp(__s1,"inode");
            if (iVar2 == 0) {
              iVar6 = mtree_atol10((char **)&local_58);
              archive_entry_set_ino(entry,iVar6);
            }
            else {
switchD_0020b973_caseD_6c:
              iVar2 = strcmp(__s1,"link");
              if (iVar2 != 0) {
switchD_0020b973_caseD_6d:
                iVar3 = strcmp(__s1,"md5");
                iVar2 = 0;
                if (iVar3 != 0) {
                  iVar3 = strcmp(__s1,"md5digest");
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    iVar2 = strcmp(__s1,"mode");
                    if (iVar2 == 0) {
                      if ((byte)(*src - 0x30) < 10) {
                        *(byte *)parsed_kws = (byte)*parsed_kws | 0x40;
                        uVar4 = (int)(char)*src - 0x30;
                        iVar2 = 0;
                        lVar8 = 0;
                        if (uVar4 < 8) {
                          pcVar5 = pcVar5 + 2;
                          lVar8 = 0;
                          do {
                            lVar8 = (ulong)uVar4 + lVar8 * 8;
                            uVar4 = (int)*pcVar5 - 0x30;
                            if (7 < uVar4) goto LAB_0020bead;
                            pcVar5 = pcVar5 + 1;
                          } while (lVar8 < 0x1000000000000000);
                          lVar8 = 0x7fffffffffffffff;
                        }
LAB_0020bead:
                        archive_entry_set_perm(entry,(mode_t)lVar8);
                        break;
                      }
                      archive_set_error(&local_50->archive,0x54,"Symbolic mode \"%s\" unsupported",
                                        src);
LAB_0020bce8:
                      iVar2 = -0x14;
                    }
                    else {
switchD_0020b973_caseD_6e:
                      iVar2 = strcmp(__s1,"nlink");
                      if (iVar2 == 0) {
                        *(byte *)parsed_kws = (byte)*parsed_kws | 0x20;
                        iVar6 = mtree_atol10((char **)&local_58);
                        archive_entry_set_nlink(entry,(uint)iVar6);
                        goto LAB_0020bcaf;
                      }
switchD_0020b973_caseD_72:
                      iVar2 = strcmp(__s1,"resdevice");
                      if (iVar2 == 0) {
                        iVar2 = parse_device(&local_48,&local_50->archive,(char *)src);
                        if (iVar2 == 0) {
                          archive_entry_set_dev(entry,local_48);
                        }
                      }
                      else {
                        iVar3 = strcmp(__s1,"rmd160");
                        iVar2 = 0;
                        if (iVar3 != 0) {
                          iVar3 = strcmp(__s1,"rmd160digest");
                          iVar2 = 0;
                          if (iVar3 != 0) {
switchD_0020b973_caseD_73:
                            iVar3 = strcmp(__s1,"sha1");
                            iVar2 = 0;
                            if (iVar3 != 0) {
                              iVar3 = strcmp(__s1,"sha1digest");
                              iVar2 = 0;
                              if (iVar3 != 0) {
                                iVar3 = strcmp(__s1,"sha256");
                                iVar2 = 0;
                                if (iVar3 != 0) {
                                  iVar3 = strcmp(__s1,"sha256digest");
                                  iVar2 = 0;
                                  if (iVar3 != 0) {
                                    iVar3 = strcmp(__s1,"sha384");
                                    iVar2 = 0;
                                    if (iVar3 != 0) {
                                      iVar3 = strcmp(__s1,"sha384digest");
                                      iVar2 = 0;
                                      if (iVar3 != 0) {
                                        iVar3 = strcmp(__s1,"sha512");
                                        iVar2 = 0;
                                        if (iVar3 != 0) {
                                          iVar3 = strcmp(__s1,"sha512digest");
                                          iVar2 = 0;
                                          if (iVar3 != 0) {
                                            iVar2 = strcmp(__s1,"size");
                                            if (iVar2 == 0) {
                                              iVar6 = mtree_atol10((char **)&local_58);
                                              archive_entry_set_size(entry,iVar6);
                                              goto LAB_0020bcaf;
                                            }
switchD_0020b973_caseD_74:
                                            iVar3 = strcmp(__s1,"tags");
                                            iVar2 = 0;
                                            if (iVar3 == 0) break;
                                            iVar2 = strcmp(__s1,"time");
                                            if (iVar2 == 0) {
                                              if (get_time_t_max_t == '\0') {
                                                get_time_t_max_t = '\x01';
                                              }
                                              iVar6 = 0;
                                              if (get_time_t_min_t != '\0') {
                                                iVar6 = -0x8000000000000000;
                                              }
                                              if (get_time_t_min_computed == '\0') {
                                                if (get_time_t_min_t == '\0') {
                                                  get_time_t_min_t = '\x01';
                                                  iVar6 = -0x8000000000000000;
                                                }
                                                get_time_t_min_computed = '\x01';
                                              }
                                              *(byte *)parsed_kws = (byte)*parsed_kws | 0x10;
                                              iVar7 = mtree_atol10((char **)&local_58);
                                              if (*local_58 == 0x2e) {
                                                local_58 = local_58 + 1;
                                                ns = mtree_atol10((char **)&local_58);
                                              }
                                              else {
                                                ns = 0;
                                              }
                                              if (iVar6 < iVar7) {
                                                iVar6 = iVar7;
                                              }
                                              if (0x7fffffffffffffff < iVar7) {
                                                iVar6 = 0x7fffffffffffffff;
                                              }
                                              archive_entry_set_mtime(entry,iVar6,ns);
                                            }
                                            else {
                                              iVar2 = strcmp(__s1,"type");
                                              if (iVar2 == 0) {
                                                switch(*src) {
                                                case 0x62:
                                                  iVar2 = strcmp((char *)src,"block");
                                                  if (iVar2 != 0) goto switchD_0020bfaa_caseD_63;
                                                  uVar4 = 0x6000;
                                                  break;
                                                case 99:
switchD_0020bfaa_caseD_63:
                                                  iVar2 = strcmp((char *)src,"char");
                                                  if (iVar2 != 0) goto switchD_0020bfaa_caseD_64;
                                                  uVar4 = 0x2000;
                                                  break;
                                                case 100:
switchD_0020bfaa_caseD_64:
                                                  iVar2 = strcmp((char *)src,"dir");
                                                  if (iVar2 != 0) goto switchD_0020bfaa_caseD_66;
                                                  uVar4 = 0x4000;
                                                  break;
                                                default:
switchD_0020bfaa_caseD_65:
                                                  archive_set_error(&local_50->archive,0x54,
                                                                                                                                        
                                                  "Unrecognized file type \"%s\"; assuming \"file\""
                                                  ,src);
                                                  archive_entry_set_filetype(entry,0x8000);
                                                  goto LAB_0020bce8;
                                                case 0x66:
switchD_0020bfaa_caseD_66:
                                                  iVar2 = strcmp((char *)src,"fifo");
                                                  if (iVar2 == 0) {
                                                    uVar4 = 0x1000;
                                                  }
                                                  else {
                                                    iVar2 = strcmp((char *)src,"file");
                                                    if (iVar2 != 0) goto switchD_0020bfaa_caseD_6c;
                                                    uVar4 = 0x8000;
                                                  }
                                                  break;
                                                case 0x6c:
switchD_0020bfaa_caseD_6c:
                                                  iVar2 = strcmp((char *)src,"link");
                                                  if (iVar2 != 0) goto switchD_0020bfaa_caseD_65;
                                                  uVar4 = 0xa000;
                                                }
                                                archive_entry_set_filetype(entry,uVar4);
                                                *(byte *)((long)parsed_kws + 1) =
                                                     *(byte *)((long)parsed_kws + 1) | 1;
                                              }
                                              else {
switchD_0020b973_caseD_75:
                                                iVar2 = strcmp(__s1,"uid");
                                                if (iVar2 == 0) {
                                                  *(byte *)((long)parsed_kws + 1) =
                                                       *(byte *)((long)parsed_kws + 1) | 2;
                                                  iVar6 = mtree_atol10((char **)&local_58);
                                                  archive_entry_set_uid(entry,iVar6);
                                                }
                                                else {
                                                  iVar2 = strcmp(__s1,"uname");
                                                  if (iVar2 != 0) {
switchD_0020b973_caseD_65:
                                                    archive_set_error(&local_50->archive,0x54,
                                                                      "Unrecognized key %s=%s",__s1,
                                                                      src);
                                                    goto LAB_0020bce8;
                                                  }
                                                  *(byte *)((long)parsed_kws + 1) =
                                                       *(byte *)((long)parsed_kws + 1) | 4;
                                                  archive_entry_copy_uname(entry,(char *)src);
                                                }
                                              }
                                            }
                                            goto LAB_0020bcaf;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              archive_entry_copy_symlink(entry,(char *)src);
            }
          }
        }
LAB_0020bcaf:
        iVar2 = 0;
        break;
      case 'i':
        goto switchD_0020b973_caseD_69;
      case 'l':
        goto switchD_0020b973_caseD_6c;
      case 'm':
        goto switchD_0020b973_caseD_6d;
      case 'n':
        goto switchD_0020b973_caseD_6e;
      case 'r':
        goto switchD_0020b973_caseD_72;
      case 's':
        goto switchD_0020b973_caseD_73;
      case 't':
        goto switchD_0020b973_caseD_74;
      case 'u':
        goto switchD_0020b973_caseD_75;
      }
LAB_0020bcb2:
      if (iVar2 < iVar9) {
        iVar9 = iVar2;
      }
      pmVar10 = pmVar10->next;
    } while (pmVar10 != (mtree_option *)0x0);
    if (iVar9 != 0) {
      return iVar9;
    }
  }
  iVar9 = 0;
  if ((*parsed_kws & 0x100) == 0) {
    archive_set_error(&local_50->archive,0x54,"Missing type keyword in mtree specification");
    iVar9 = -0x14;
  }
  return iVar9;
}

Assistant:

static int
parse_line(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mp, int *parsed_kws)
{
	struct mtree_option *iter;
	int r = ARCHIVE_OK, r1;

	for (iter = mp->options; iter != NULL; iter = iter->next) {
		r1 = parse_keyword(a, mtree, entry, iter, parsed_kws);
		if (r1 < r)
			r = r1;
	}
	if (r == ARCHIVE_OK && (*parsed_kws & MTREE_HAS_TYPE) == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Missing type keyword in mtree specification");
		return (ARCHIVE_WARN);
	}
	return (r);
}